

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.c
# Opt level: O2

function * getMainFunc(vm *v)

{
  uint uVar1;
  module *pmVar2;
  export_pointer paVar3;
  int iVar4;
  function *pfVar5;
  uint *puVar6;
  long lVar7;
  long lVar8;
  
  pmVar2 = v->m;
  if ((pmVar2->start_sec).start_segment_count == 1) {
    puVar6 = (pmVar2->start_sec).start_segment_addr;
LAB_00104629:
    if ((ulong)*puVar6 != 0xffffffff) {
      pfVar5 = (function *)(*(v->func).get_ele)(&v->func,(ulong)*puVar6);
      return pfVar5;
    }
  }
  else {
    uVar1 = (pmVar2->export_sec).export_segment_count;
    lVar7 = 8;
    for (lVar8 = -0xc; (ulong)uVar1 * 0x10 + lVar8 != -0xc; lVar8 = lVar8 + -0x10) {
      paVar3 = (pmVar2->export_sec).export_segment_addr;
      if (*(char *)((long)&paVar3->name + lVar7) == '\0') {
        iVar4 = strcmp(*(char **)((long)paVar3 + lVar7 + -8),"main");
        if (iVar4 == 0) {
          puVar6 = (uint *)((long)paVar3 - lVar8);
          goto LAB_00104629;
        }
      }
      lVar7 = lVar7 + 0x10;
    }
  }
  return (function *)0x0;
}

Assistant:

function *getMainFunc(vm *v) {
    function_index f_index = -1;
    module *m = v->m;
    if (m->start_sec.start_segment_count == 1) {
        /*获取启动段的启动函数的索引*/
        f_index = *(m->start_sec.start_segment_addr);
    } else {
        for (int i = 0; i < m->export_sec.export_segment_count; ++i) {
            export_pointer ep = m->export_sec.export_segment_addr + i;
            if (ep->ex_desc.tag == func_im_export_tag && !strcmp((const char *) ep->name, "main")) {
                f_index = ep->ex_desc.index;
                break;
            }
        }
    }
    function *f = NULL;
    if (f_index != -1)
        f = v->func.get_ele(&v->func, f_index);
    return f;
}